

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

int sat_solver2_check_watched(sat_solver2 *s)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  clause *pcVar4;
  int *pArray;
  int claSat [2];
  int m;
  int j;
  int k;
  int i;
  clause *c;
  sat_solver2 *s_local;
  
  memset(&pArray,0,8);
  j = 0;
  do {
    if (SBORROW4(j,s->size * 2) == j + s->size * -2 < 0) {
      return 0;
    }
    piVar3 = veci_begin(s->wlists + j);
    claSat[0] = 0;
    for (m = 0; iVar1 = veci_size(s->wlists + j), m < iVar1; m = m + 1) {
      pcVar4 = clause2_read(s,piVar3[m]);
      for (claSat[1] = 0; claSat[1] < (int)((uint)*pcVar4 >> 0xb); claSat[1] = claSat[1] + 1) {
        iVar1 = lit_var((lit)pcVar4[(long)claSat[1] + 1]);
        iVar1 = var_value(s,iVar1);
        iVar2 = lit_sign((lit)pcVar4[(long)claSat[1] + 1]);
        if (iVar1 == iVar2) break;
      }
      if (claSat[1] == (uint)*pcVar4 >> 0xb) {
        piVar3[claSat[0]] = piVar3[m];
        claSat[0] = claSat[0] + 1;
      }
      else {
        claSat[(ulong)((uint)*pcVar4 & 1) - 2] = claSat[(ulong)((uint)*pcVar4 & 1) - 2] + 1;
      }
    }
    veci_resize(s->wlists + j,claSat[0]);
    j = j + 1;
  } while( true );
}

Assistant:

int sat_solver2_check_watched( sat_solver2* s )
{
    clause * c;
    int i, k, j, m;
    int claSat[2] = {0};
    // update watches
    for ( i = 0; i < s->size*2; i++ )
    {
        int * pArray = veci_begin(&s->wlists[i]);
        for ( m = k = 0; k < veci_size(&s->wlists[i]); k++ )
        {
            c = clause2_read(s, pArray[k]);
            for ( j = 0; j < (int)c->size; j++ )
                if ( var_value(s, lit_var(c->lits[j])) == lit_sign(c->lits[j]) ) // true lit
                    break;
            if ( j == (int)c->size )
            {
                pArray[m++] = pArray[k];
                continue;
            }
            claSat[c->lrn]++;
        }
        veci_resize(&s->wlists[i],m);
        if ( m == 0 )
        {
//            s->wlists[i].cap = 0;
//            s->wlists[i].size = 0;
//            ABC_FREE( s->wlists[i].ptr );
        }
    }
//    printf( "\nClauses = %d  (Sat = %d).  Learned = %d  (Sat = %d).\n",
//        s->stats.clauses, claSat[0], s->stats.learnts, claSat[1] );
    return 0;
}